

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

vector<lzham::adaptive_bit_model> * __thiscall
lzham::vector<lzham::adaptive_bit_model>::operator=
          (vector<lzham::adaptive_bit_model> *this,vector<lzham::adaptive_bit_model> *other)

{
  bool bVar1;
  uint uVar2;
  vector<lzham::adaptive_bit_model> *in_RSI;
  vector<lzham::adaptive_bit_model> *in_RDI;
  uint i;
  adaptive_bit_model *pSrc;
  adaptive_bit_model *pDst;
  uint in_stack_000001c4;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  vector<lzham::adaptive_bit_model> *in_stack_ffffffffffffffd8;
  vector<lzham::adaptive_bit_model> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    if (in_RDI->m_capacity < in_RSI->m_size) {
      clear((vector<lzham::adaptive_bit_model> *)
            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      bVar1 = increase_capacity((vector<lzham::adaptive_bit_model> *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                (uint)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0),
                                SUB81((ulong)in_RDI >> 0x10,0));
      if (!bVar1) {
        lzham_fail(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4);
        return in_RDI;
      }
    }
    else {
      try_resize(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                 SUB41((uint)in_stack_ffffffffffffffd0 >> 0x18,0));
    }
    for (uVar2 = in_RSI->m_size; uVar2 != 0; uVar2 = uVar2 - 1) {
      helpers::construct<lzham::adaptive_bit_model,lzham::adaptive_bit_model>
                ((adaptive_bit_model *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                 (adaptive_bit_model *)in_RDI);
    }
    in_RDI->m_size = in_RSI->m_size;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

inline vector& operator= (const vector& other)
      {
         if (this == &other)
            return *this;

         if (m_capacity >= other.m_size)
            try_resize(0);
         else
         {
            clear();
            if (!increase_capacity(other.m_size, false))
            {
               LZHAM_FAIL("lzham::vector operator=: Out of memory!");
               return *this;
            }
         }

         if (LZHAM_IS_BITWISE_COPYABLE(T))
            memcpy(m_p, other.m_p, other.m_size * sizeof(T));
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint i = other.m_size; i > 0; i--)
               helpers::construct(pDst++, *pSrc++);
         }

         m_size = other.m_size;

         return *this;
      }